

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64builder.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::a64::Builder::finalize(Builder *this)

{
  BaseEmitter *in_RDI;
  BaseBuilder *in_stack_00000028;
  Assembler a;
  Error _err;
  undefined4 in_stack_ffffffffffffff08;
  EncodingOptions in_stack_ffffffffffffff0c;
  BaseEmitter *this_00;
  BaseEmitter local_c8;
  Error local_14;
  Error local_4;
  
  local_14 = BaseBuilder::runPasses(in_stack_00000028);
  local_4 = local_14;
  if (local_14 == 0) {
    this_00 = &local_c8;
    Assembler::Assembler
              ((Assembler *)this_00,
               (CodeHolder *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    BaseEmitter::encodingOptions(in_RDI);
    BaseEmitter::addEncodingOptions(this_00,in_stack_ffffffffffffff0c);
    BaseEmitter::diagnosticOptions(in_RDI);
    BaseEmitter::addDiagnosticOptions(this_00,in_stack_ffffffffffffff0c);
    local_4 = BaseBuilder::serializeTo
                        ((BaseBuilder *)a.super_BaseAssembler._section,
                         (BaseEmitter *)a.super_BaseAssembler.super_BaseEmitter._funcs.validate);
    Assembler::~Assembler((Assembler *)0x166d65);
  }
  return local_4;
}

Assistant:

Error Builder::finalize() {
  ASMJIT_PROPAGATE(runPasses());
  Assembler a(_code);
  a.addEncodingOptions(encodingOptions());
  a.addDiagnosticOptions(diagnosticOptions());
  return serializeTo(&a);
}